

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

SquareMatrix3<double> * __thiscall
OpenMD::SquareMatrix3<double>::transpose
          (SquareMatrix3<double> *__return_storage_ptr__,SquareMatrix3<double> *this)

{
  uint i;
  long lVar1;
  double (*padVar2) [3];
  double (*padVar3) [3];
  long lVar4;
  
  SquareMatrix<double,_3>::SquareMatrix(&__return_storage_ptr__->super_SquareMatrix<double,_3>);
  padVar2 = (double (*) [3])__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    padVar3 = padVar2;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).data_[0][0] =
           (((SquareMatrix<double,_3> *)*(double (*) [3])this)->super_RectMatrix<double,_3U,_3U>).
           data_[0][lVar4];
      padVar3 = padVar3 + 1;
    }
    this = (SquareMatrix3<double> *)((long)this + 0x18);
    padVar2 = (double (*) [3])(*padVar2 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix3<Real> transpose() const {
      SquareMatrix3<Real> result;

      for (unsigned int i = 0; i < 3; i++)
        for (unsigned int j = 0; j < 3; j++)
          result(j, i) = this->data_[i][j];

      return result;
    }